

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void algorithm_suite::transform_empty(void)

{
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = 0;
  local_c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2f7,"void algorithm_suite::transform_empty()",&local_8,&local_c);
  return;
}

Assistant:

void transform_empty()
{
    std::vector<double> input = {};
    cumulative::moment<double> filter;
    std::transform(input.begin(), input.end(), push_inserter(filter), squared<double>());
    TRIAL_TEST_EQ(filter.size(), 0);
}